

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<std::complex<double>_>::PrepareSystems
          (TPZDohrSubstruct<std::complex<double>_> *this)

{
  TPZFMatrix<std::complex<double>_> *this_00;
  list<long,_std::allocator<long>_> *plVar1;
  TPZFMatrix<std::complex<double>_> *this_01;
  undefined8 *puVar2;
  size_t newRows;
  _List_node_base *p_Var3;
  undefined1 auVar4 [16];
  complex<double> beta;
  complex<double> *pcVar5;
  TPZFMatrix<std::complex<double>_> *z;
  long lVar6;
  int64_t iVar7;
  ulong uVar8;
  ulong in_R9;
  _List_node_base *p_Var9;
  long lVar10;
  int count;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  TPZFMatrix<std::complex<double>_> I_star;
  TPZFMatrix<std::complex<double>_> C_star_trans;
  TPZFMatrix<std::complex<double>_> C_transposed;
  TPZFMatrix<std::complex<double>_> KeC;
  undefined **ppuVar14;
  undefined **ppuVar15;
  _func_int **pp_Var16;
  int iVar17;
  int local_2a0;
  TPZAutoPointer<TPZBaseMatrix> local_290;
  TPZStepSolver<std::complex<double>_> *local_288;
  TPZFMatrix<std::complex<double>_> *local_280;
  TPZFMatrix<std::complex<double>_> *local_278;
  TPZFMatrix<std::complex<double>_> local_270;
  TPZFMatrix<std::complex<double>_> local_1e0;
  TPZFMatrix<std::complex<double>_> local_150;
  TPZFMatrix<std::complex<double>_> local_c0;
  
  iVar7 = (this->fCoarseIndex).fNElements;
  lVar10 = (this->fC).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  lVar6 = (this->fC).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
  local_150.fElem = (complex<double> *)0x0;
  local_150.fGiven = (complex<double> *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar6;
  local_150.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar10;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  ppuVar15 = &PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  ppuVar14 = &PTR__TPZVec_01840c80;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01840c80;
  local_150.fWork.fStore = (complex<double> *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  uVar11 = lVar10 * lVar6;
  if (uVar11 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (uVar11 < 0x1000000000000000) {
      uVar8 = uVar11 * 0x10;
    }
    pcVar5 = (complex<double> *)operator_new__(uVar8);
    memset(pcVar5,0,uVar11 * 0x10);
    local_150.fElem = pcVar5;
  }
  TPZFMatrix<std::complex<double>_>::Transpose
            (&this->fC,&local_150.super_TPZMatrix<std::complex<double>_>);
  iVar17 = this->fNEquations;
  local_2a0 = (int)iVar7;
  lVar10 = (long)local_2a0;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
  local_c0.fElem = (complex<double> *)0x0;
  local_c0.fGiven = (complex<double> *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)iVar17;
  local_c0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar10;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork.fStore = (complex<double> *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  uVar11 = iVar17 * lVar10;
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)ppuVar15;
  local_c0.fWork._vptr_TPZVec = (_func_int **)ppuVar14;
  if (uVar11 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (uVar11 < 0x1000000000000000) {
      uVar8 = uVar11 * 0x10;
    }
    pcVar5 = (complex<double> *)operator_new__(uVar8);
    memset(pcVar5,0,uVar11 * 0x10);
    local_c0.fElem = pcVar5;
  }
  TPZStepSolver<std::complex<double>_>::Solve
            (&this->fInvertedStiffness,&local_150,&local_c0,(TPZFMatrix<std::complex<double>_> *)0x0
            );
  newRows = (this->fInvertedStiffness).fSingular.super__List_base<long,_std::allocator<long>_>.
            _M_impl._M_node._M_size;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable =
       (_func_int **)
       (this->fInvertedStiffness).super_TPZMatrixSolver<std::complex<double>_>.fContainer.fRef;
  LOCK();
  (((TPZReference *)
   local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
   _vptr_TPZSavable)->fCounter).super___atomic_base<int>._M_i =
       (((TPZReference *)
        local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_280 = &this->fNullPivots;
  local_288 = &this->fInvertedStiffness;
  local_278 = &this->fC;
  TPZFMatrix<std::complex<double>_>::Resize
            (local_280,newRows,
             (((TPZReference *)
              local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable)->fPointer->super_TPZBaseMatrix).fCol);
  plVar1 = &(this->fInvertedStiffness).fSingular;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)&local_270);
  memset((this->fNullPivots).fElem,0,
         (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10)
  ;
  (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  p_Var9 = (this->fInvertedStiffness).fSingular.super__List_base<long,_std::allocator<long>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var9 != (_List_node_base *)plVar1 &&
      (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow != 0) {
    lVar6 = 0;
    lVar12 = 0;
    do {
      p_Var3 = p_Var9[1]._M_next;
      if ((((this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <=
            lVar12) || ((long)p_Var3 < 0)) ||
         ((this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <=
          (long)p_Var3)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      puVar2 = (undefined8 *)
               ((this->fNullPivots).fElem
                [(long)p_Var3 *
                 (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow
                ]._M_value + lVar6);
      *puVar2 = 0x3ff0000000000000;
      puVar2[1] = 0;
      lVar12 = lVar12 + 1;
      p_Var9 = p_Var9->_M_next;
      lVar6 = lVar6 + 0x10;
    } while (p_Var9 != (_List_node_base *)plVar1);
  }
  lVar6 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
          lVar10;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
  local_270.fElem = (complex<double> *)0x0;
  local_270.fGiven = (complex<double> *)0x0;
  local_270.fSize = 0;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = lVar6;
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar6;
  TPZVec<int>::TPZVec(&local_270.fPivot.super_TPZVec<int>,0);
  local_270.fPivot.super_TPZVec<int>.fStore = local_270.fPivot.fExtAlloc;
  local_270.fPivot.super_TPZVec<int>.fNElements = 0;
  local_270.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_270.fWork.fStore = (complex<double> *)0x0;
  local_270.fWork.fNElements = 0;
  local_270.fWork.fNAlloc = 0;
  pp_Var16 = (_func_int **)ppuVar15;
  local_270.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)ppuVar15;
  local_270.fWork._vptr_TPZVec = (_func_int **)ppuVar14;
  if (lVar6 != 0) {
    sVar13 = lVar6 * lVar6 * 0x10;
    uVar11 = 0xffffffffffffffff;
    if ((ulong)(lVar6 * lVar6) < 0x1000000000000000) {
      uVar11 = sVar13;
    }
    pcVar5 = (complex<double> *)operator_new__(uVar11);
    memset(pcVar5,0,sVar13);
    local_270.fElem = pcVar5;
  }
  memset(local_270.fElem,0,
         local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10);
  local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix._24_2_ =
       local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix._24_2_ & 0xff00;
  iVar7 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
          lVar10;
  lVar6 = lVar10;
  if (local_2a0 < iVar7) {
    do {
      if (((lVar6 < 0) ||
          (local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow <= lVar6)) ||
         (local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol <= lVar6)) {
        TPZFMatrix<std::complex<double>_>::Error
                  ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      *(undefined8 *)
       local_270.fElem
       [local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar6 + lVar6].
       _M_value = 0x3ff0000000000000;
      *(undefined8 *)
       ((long)local_270.fElem
              [local_270.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow * lVar6 +
               lVar6]._M_value + 8) = 0;
      lVar6 = lVar6 + 1;
      iVar7 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
              lVar10;
    } while (lVar6 < iVar7);
  }
  this_00 = &this->fC_star;
  TPZFMatrix<std::complex<double>_>::Resize(this_00,iVar7,(long)this->fNEquations);
  iVar7 = lVar10;
  TPZMatrix<std::complex<double>_>::PutSub
            (&this_00->super_TPZMatrix<std::complex<double>_>,0,0,local_278);
  TPZMatrix<std::complex<double>_>::PutSub
            (&this_00->super_TPZMatrix<std::complex<double>_>,lVar10,0,local_280);
  this_01 = &this->fKeC_star;
  TPZFMatrix<std::complex<double>_>::Resize
            (this_01,(long)this->fNEquations,
             (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
             lVar10);
  iVar17 = this->fNEquations;
  lVar10 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
           lVar10;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01841760;
  local_1e0.fElem = (complex<double> *)0x0;
  local_1e0.fGiven = (complex<double> *)0x0;
  local_1e0.fSize = 0;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow = (long)iVar17;
  local_1e0.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol = lVar10;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork.fStore = (complex<double> *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  uVar11 = lVar10 * iVar17;
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)ppuVar15;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)ppuVar14;
  if (uVar11 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (uVar11 < 0x1000000000000000) {
      uVar8 = uVar11 * 0x10;
    }
    pcVar5 = (complex<double> *)operator_new__(uVar8);
    memset(pcVar5,0,uVar11 * 0x10);
    local_1e0.fElem = pcVar5;
  }
  TPZFMatrix<std::complex<double>_>::Transpose
            (this_00,&local_1e0.super_TPZMatrix<std::complex<double>_>);
  TPZStepSolver<std::complex<double>_>::Solve
            (local_288,&local_1e0,this_01,(TPZFMatrix<std::complex<double>_> *)0x0);
  z = (TPZFMatrix<std::complex<double>_> *)operator_new(0x90);
  lVar10 = iVar7 + (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                   fRow;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = 0;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = 0;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = lVar10;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = lVar10;
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (z->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
       = (_func_int **)&PTR__TPZFMatrix_01841760;
  z->fElem = (complex<double> *)0x0;
  z->fGiven = (complex<double> *)0x0;
  z->fSize = 0;
  TPZVec<int>::TPZVec(&(z->fPivot).super_TPZVec<int>,0);
  iVar17 = (int)iVar7;
  (z->fPivot).super_TPZVec<int>._vptr_TPZVec = (_func_int **)ppuVar15;
  (z->fPivot).super_TPZVec<int>.fStore = (z->fPivot).fExtAlloc;
  (z->fPivot).super_TPZVec<int>.fNElements = 0;
  (z->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (z->fWork)._vptr_TPZVec = (_func_int **)ppuVar14;
  (z->fWork).fStore = (complex<double> *)0x0;
  (z->fWork).fNElements = 0;
  (z->fWork).fNAlloc = 0;
  if (lVar10 != 0) {
    sVar13 = lVar10 * lVar10 * 0x10;
    uVar11 = 0xffffffffffffffff;
    if ((ulong)(lVar10 * lVar10) < 0x1000000000000000) {
      uVar11 = sVar13;
    }
    pcVar5 = (complex<double> *)operator_new__(uVar11);
    memset(pcVar5,0,sVar13);
    z->fElem = pcVar5;
  }
  beta._M_value._8_8_ = pp_Var16;
  beta._M_value._0_8_ = ppuVar14;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_R9;
  TPZFMatrix<std::complex<double>_>::MultAdd
            (this_00,this_01,&local_270,z,(complex<double>)(auVar4 << 0x40),beta,iVar17);
  local_290.fRef = (TPZReference *)0x0;
  local_290.fRef = (TPZReference *)operator_new(0x10);
  ((local_290.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
  (local_290.fRef)->fPointer = (TPZBaseMatrix *)z;
  LOCK();
  ((local_290.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  TPZMatrixSolver<std::complex<double>_>::SetMatrix
            (&(this->finv).super_TPZMatrixSolver<std::complex<double>_>,&local_290);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer(&local_290);
  TPZStepSolver<std::complex<double>_>::SetDirect(&this->finv,ELU);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_1e0);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_270);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_c0);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_150);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::PrepareSystems() {
	int ncoarse = fCoarseIndex.NElements();
	//TPZFMatrix<TVar> C_transposed;
	/****************************************
	 * TEMPORARIO!!!!!!!!!!!!!!
	 */
	//  int nc = fC.Cols();
	//  fC.Redim(1,nc);
	//  fC(0,nc-1) = 1.;
	
	/*
	 *******************************************/
	/** Tou mantendo isso abaixo só pra fatoracao de K ser TVarizada e se obter os pivos nulos (caso haja) */
	
	//  ofstream out("saida.nb");
	//  this->fStiffness->Print("fK = ",out,EMathematicaInput);
	//  fC.Print("fCi = ",out,EMathematicaInput);
	TPZFMatrix<TVar> C_transposed(fC.Cols(),fC.Rows());
	fC.Transpose(&C_transposed);
	//Ke_inv*C(i)_trans
	TPZFMatrix<TVar> KeC(fNEquations,ncoarse);
	fInvertedStiffness.Solve(C_transposed,KeC);
	/** */
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Number of zero pivots of the substructure : " << fInvertedStiffness.Singular().size();
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	//  std::cout << KeC;
	//  int neq = fInvertedStiffness.Matrix()->Rows();
	//Constructing C barra = NullPivots
	fNullPivots.Resize(fInvertedStiffness.Singular().size(),fInvertedStiffness.Matrix()->Cols());
	fNullPivots.Zero();
	//  fEigenVectors.Redim(fInvertedStiffness.Matrix()->Rows(),fInvertedStiffness.Singular().size());
	if(fNullPivots.Rows())
	{
		//    out << "NullPivots = {";
		int count = 0;
		std::list<int64_t>::iterator it = fInvertedStiffness.Singular().begin();
		for(;it != fInvertedStiffness.Singular().end(); it++,count++)
		{
			//      out << *it;
			//      if(count < fInvertedStiffness.Singular().size()-1) out << ",";
			fNullPivots(count,*it) = 1.;
		}
		//    out << "};\n";
		//    fInvertedStiffness.Solve(fEigenVectors,fEigenVectors);
	}
	//  NullPivots.Print("fNullPivots = ",out,EMathematicaInput);
	
	//Constructing I star
	TPZFMatrix<TVar> I_star(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	I_star.Zero();
	int i;
	for (i=ncoarse;i<ncoarse+fNullPivots.Rows();i++) {
		I_star(i,i)=1;
	}
	//Constructing C_star and storing in fC_star
	fC_star.Resize(ncoarse+fNullPivots.Rows(),fNEquations);
	fC_star.PutSub(0,0,fC);
	fC_star.PutSub(ncoarse,0,fNullPivots);
	//  C_star.Print("CStar = ",out,EMathematicaInput);
	//constructing K_star_inv*C_star_trans and storing it in fKeC_star
	fKeC_star.Resize(fNEquations,ncoarse+fNullPivots.Rows());
	TPZFMatrix<TVar> C_star_trans(fNEquations,ncoarse+fNullPivots.Rows());
	fC_star.Transpose(&C_star_trans);
	fInvertedStiffness.Solve(C_star_trans,fKeC_star);
	//Constructing StepSolver finv
	TPZFMatrix<TVar> *temp1 = new TPZFMatrix<TVar>(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	fC_star.MultAdd(fKeC_star,I_star,*temp1,-1,1,0);
	finv.SetMatrix(temp1);
	finv.SetDirect(ELU);
}